

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BuildSystem.cpp
# Opt level: O3

bool __thiscall
anon_unknown.dwarf_1c0a25::SwiftCompilerShellCommand::configureAttribute
          (SwiftCompilerShellCommand *this,ConfigureContext *ctx,StringRef name,StringRef value)

{
  bool bVar1;
  char *pcVar2;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *this_00;
  ConfigureContext *ctx_00;
  string *this_01;
  char *pcVar3;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *__x;
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  StringRef Str;
  StringRef Separator;
  StringRef Separator_00;
  StringRef Separator_01;
  StringRef Separator_02;
  StringRef name_00;
  SmallVector<llvm::StringRef,_32U> objects;
  undefined1 local_2a8 [16];
  pointer local_298;
  StringRef local_288;
  llvm *local_278;
  char *pcStack_270;
  llvm *local_268;
  char *pcStack_260;
  undefined1 local_258 [16];
  pointer local_248;
  Child local_240;
  ulong local_238;
  Child local_230 [64];
  
  pcVar3 = (char *)value.Length;
  name_00.Length = (llvm *)value.Data;
  local_288.Length = name.Length;
  local_288.Data = name.Data;
  local_2a8 = (undefined1  [16])value;
  switch(local_288.Length) {
  case 7:
    if (*(int *)((bool *)local_288.Data + 3) == 0x73656372 && *(int *)local_288.Data == 0x72756f73)
    {
      local_240.twine = (Twine *)local_230;
      local_238 = 0x2000000000;
      Separator_01.Length = 1;
      Separator_01.Data = " ";
      llvm::StringRef::split
                ((StringRef *)local_2a8,(SmallVectorImpl<llvm::StringRef> *)&local_240,Separator_01,
                 -1,false);
      local_258 = ZEXT816(0);
      local_248 = (pointer)0x0;
      std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
      _M_range_initialize<llvm::StringRef*>
                ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)local_258,
                 local_240.twine,&(local_240.twine)->LHS + (local_238 & 0xffffffff) * 2);
      local_298 = (this->sourcesList).
                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_end_of_storage;
      (this->sourcesList).
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage = local_248;
      local_2a8._0_8_ =
           (this->sourcesList).
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
      local_2a8._8_8_ =
           (this->sourcesList).
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
      (this->sourcesList).
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start = (pointer)local_258._0_8_;
      (this->sourcesList).
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish = (pointer)local_258._8_8_;
    }
    else {
      if (*(int *)((bool *)local_288.Data + 3) != 0x73746365 || *(int *)local_288.Data != 0x656a626f
         ) break;
      local_240.twine = (Twine *)local_230;
      local_238 = 0x2000000000;
      Separator.Length = 1;
      Separator.Data = " ";
      llvm::StringRef::split
                ((StringRef *)local_2a8,(SmallVectorImpl<llvm::StringRef> *)&local_240,Separator,-1,
                 false);
      local_258 = ZEXT816(0);
      local_248 = (pointer)0x0;
      std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
      _M_range_initialize<llvm::StringRef*>
                ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)local_258,
                 local_240.twine,&(local_240.twine)->LHS + (local_238 & 0xffffffff) * 2);
      local_298 = (this->objectsList).
                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_end_of_storage;
      (this->objectsList).
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage = local_248;
      local_2a8._0_8_ =
           (this->objectsList).
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
      local_2a8._8_8_ =
           (this->objectsList).
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
      (this->objectsList).
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start = (pointer)local_258._0_8_;
      (this->objectsList).
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish = (pointer)local_258._8_8_;
    }
    __x = (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           *)local_258;
    local_258 = (undefined1  [16])0x0;
    local_248 = (pointer)0x0;
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)local_2a8);
    goto LAB_00163221;
  case 8:
  case 9:
  case 0xd:
  case 0xe:
  case 0xf:
  case 0x10:
  case 0x11:
    break;
  case 10:
    if (*(short *)((bool *)local_288.Data + 8) == 0x656c &&
        *(long *)local_288.Data == 0x6261747563657865) {
      local_240.twine = (Twine *)local_230;
      if (name_00.Length == (llvm *)0x0) {
        local_238 = 0;
        local_230[0].character = '\0';
      }
      else {
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&local_240,name_00.Length,pcVar3 + (long)name_00.Length);
      }
      this_01 = (string *)&this->executable;
LAB_00163367:
      std::__cxx11::string::operator=(this_01,(string *)&local_240.character);
      if (&(local_240.twine)->LHS != local_230) {
        operator_delete(local_240.twine,CONCAT71(local_230[0]._1_7_,local_230[0].character) + 1);
      }
      return true;
    }
    if (*(short *)((bool *)local_288.Data + 8) == 0x6874 &&
        *(long *)local_288.Data == 0x61702d73706d6574) {
      local_240.twine = (Twine *)local_230;
      if (name_00.Length == (llvm *)0x0) {
        local_238 = 0;
        local_230[0].character = '\0';
      }
      else {
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&local_240,name_00.Length,pcVar3 + (long)name_00.Length);
      }
      this_01 = (string *)&this->tempsPath;
      goto LAB_00163367;
    }
    if (*(short *)((bool *)local_288.Data + 8) == 0x7972 &&
        *(long *)local_288.Data == 0x617262696c2d7369) {
      ctx_00 = (ConfigureContext *)&this->isLibrary;
      pcVar2 = (char *)0xa;
      local_268 = name_00.Length;
      pcStack_260 = pcVar3;
      goto LAB_001632db;
    }
    if (*(short *)((bool *)local_288.Data + 8) != 0x7367 ||
        *(long *)local_288.Data != 0x72612d726568746f) break;
    local_240.twine = (Twine *)local_230;
    local_238 = 0x2000000000;
    Separator_00.Length = 1;
    Separator_00.Data = " ";
    llvm::StringRef::split
              ((StringRef *)local_2a8,(SmallVectorImpl<llvm::StringRef> *)&local_240,Separator_00,-1
               ,false);
    local_2a8._0_8_ = (char *)0x0;
    local_2a8._8_8_ = 0;
    local_298 = (pointer)0x0;
    std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
    _M_range_initialize<llvm::StringRef*>
              ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)local_2a8,
               local_240.twine,&(local_240.twine)->LHS + (local_238 & 0xffffffff) * 2);
    this_00 = &this->otherArgs;
    goto LAB_00163216;
  case 0xb:
    if (*(long *)((bool *)local_288.Data + 3) == 0x656d616e2d656c75 &&
        *(long *)local_288.Data == 0x6e2d656c75646f6d) {
      local_240.twine = (Twine *)local_230;
      if (name_00.Length == (llvm *)0x0) {
        local_238 = 0;
        local_230[0].character = '\0';
      }
      else {
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&local_240,name_00.Length,pcVar3 + (long)name_00.Length);
      }
      this_01 = (string *)&this->moduleName;
      goto LAB_00163367;
    }
    if (*(long *)((bool *)local_288.Data + 3) == 0x736461657268742d &&
        *(long *)local_288.Data == 0x657268742d6d756e) {
      Str.Length = 10;
      Str.Data = pcVar3;
      bVar1 = llvm::getAsSignedInteger
                        (name_00.Length,Str,(uint)&local_240,(longlong *)name_00.Length);
      if ((bVar1) || ((Twine *)(long)local_240.decI != local_240.twine)) {
        llvm::Twine::Twine((Twine *)local_2a8,"\'",&local_288);
        pcVar3 = "\' should be an int.";
      }
      else {
        if (-1 < local_240.decI) {
          local_240.twine = (Twine *)local_230;
          if (name_00.Length == (llvm *)0x0) {
            local_238 = 0;
            local_230[0].character = '\0';
          }
          else {
            std::__cxx11::string::_M_construct<char_const*>
                      ((string *)&local_240,name_00.Length,pcVar3 + (long)name_00.Length);
          }
          this_01 = (string *)&this->numThreads;
          goto LAB_00163367;
        }
        llvm::Twine::Twine((Twine *)local_2a8,"\'",&local_288);
        pcVar3 = "\' should be greater than or equal to zero.";
      }
      llvm::Twine::Twine((Twine *)local_258,pcVar3);
      llvm::operator+((Twine *)&local_240,(Twine *)local_2a8,(Twine *)local_258);
      llbuild::buildsystem::ConfigureContext::error(ctx,(Twine *)&local_240);
      return false;
    }
    break;
  case 0xc:
    if (*(int *)((bool *)local_288.Data + 8) != 0x73687461 ||
        *(long *)local_288.Data != 0x702d74726f706d69) break;
    local_240.twine = (Twine *)local_230;
    local_238 = 0x2000000000;
    Separator_02.Length = 1;
    Separator_02.Data = " ";
    llvm::StringRef::split
              ((StringRef *)local_2a8,(SmallVectorImpl<llvm::StringRef> *)&local_240,Separator_02,-1
               ,false);
    local_2a8._0_8_ = (char *)0x0;
    local_2a8._8_8_ = 0;
    local_298 = (pointer)0x0;
    std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
    _M_range_initialize<llvm::StringRef*>
              ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)local_2a8,
               local_240.twine,&(local_240.twine)->LHS + (local_238 & 0xffffffff) * 2);
    this_00 = &this->importPaths;
LAB_00163216:
    __x = (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           *)local_2a8;
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::operator=(this_00,__x);
LAB_00163221:
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector(__x);
    if (&(local_240.twine)->LHS == local_230) {
      return true;
    }
    free(local_240.twine);
    return true;
  case 0x12:
    auVar5[0] = -(*local_288.Data == 'm');
    auVar5[1] = -(((bool *)local_288.Data)[1] == (bool)'o');
    auVar5[2] = -(((bool *)local_288.Data)[2] == (bool)'d');
    auVar5[3] = -(((bool *)local_288.Data)[3] == (bool)'u');
    auVar5[4] = -(((bool *)local_288.Data)[4] == (bool)'l');
    auVar5[5] = -(((bool *)local_288.Data)[5] == (bool)'e');
    auVar5[6] = -(((bool *)local_288.Data)[6] == (bool)'-');
    auVar5[7] = -(((bool *)local_288.Data)[7] == (bool)'o');
    auVar5[8] = -(((bool *)local_288.Data)[8] == (bool)'u');
    auVar5[9] = -(((bool *)local_288.Data)[9] == (bool)'t');
    auVar5[10] = -(((bool *)local_288.Data)[10] == (bool)'p');
    auVar5[0xb] = -(((bool *)local_288.Data)[0xb] == (bool)'u');
    auVar5[0xc] = -(((bool *)local_288.Data)[0xc] == (bool)'t');
    auVar5[0xd] = -(((bool *)local_288.Data)[0xd] == (bool)'-');
    auVar5[0xe] = -(((bool *)local_288.Data)[0xe] == (bool)'p');
    auVar5[0xf] = -(((bool *)local_288.Data)[0xf] == (bool)'a');
    auVar7[0] = -((char)*(undefined2 *)((bool *)local_288.Data + 0x10) == 't');
    auVar7[1] = -((char)((ushort)*(undefined2 *)((bool *)local_288.Data + 0x10) >> 8) == 'h');
    auVar7[2] = 0xff;
    auVar7[3] = 0xff;
    auVar7[4] = 0xff;
    auVar7[5] = 0xff;
    auVar7[6] = 0xff;
    auVar7[7] = 0xff;
    auVar7[8] = 0xff;
    auVar7[9] = 0xff;
    auVar7[10] = 0xff;
    auVar7[0xb] = 0xff;
    auVar7[0xc] = 0xff;
    auVar7[0xd] = 0xff;
    auVar7[0xe] = 0xff;
    auVar7[0xf] = 0xff;
    auVar7 = auVar7 & auVar5;
    if ((ushort)((ushort)(SUB161(auVar7 >> 7,0) & 1) | (ushort)(SUB161(auVar7 >> 0xf,0) & 1) << 1 |
                 (ushort)(SUB161(auVar7 >> 0x17,0) & 1) << 2 |
                 (ushort)(SUB161(auVar7 >> 0x1f,0) & 1) << 3 |
                 (ushort)(SUB161(auVar7 >> 0x27,0) & 1) << 4 |
                 (ushort)(SUB161(auVar7 >> 0x2f,0) & 1) << 5 |
                 (ushort)(SUB161(auVar7 >> 0x37,0) & 1) << 6 |
                 (ushort)(SUB161(auVar7 >> 0x3f,0) & 1) << 7 |
                 (ushort)(SUB161(auVar7 >> 0x47,0) & 1) << 8 |
                 (ushort)(SUB161(auVar7 >> 0x4f,0) & 1) << 9 |
                 (ushort)(SUB161(auVar7 >> 0x57,0) & 1) << 10 |
                 (ushort)(SUB161(auVar7 >> 0x5f,0) & 1) << 0xb |
                 (ushort)(SUB161(auVar7 >> 0x67,0) & 1) << 0xc |
                 (ushort)(SUB161(auVar7 >> 0x6f,0) & 1) << 0xd |
                 (ushort)(SUB161(auVar7 >> 0x77,0) & 1) << 0xe |
                (ushort)(byte)(auVar7[0xf] >> 7) << 0xf) == 0xffff) {
      local_240.twine = (Twine *)local_230;
      if (name_00.Length == (llvm *)0x0) {
        local_238 = 0;
        local_230[0].character = '\0';
      }
      else {
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&local_240,name_00.Length,pcVar3 + (long)name_00.Length);
      }
      this_01 = (string *)&this->moduleOutputPath;
      goto LAB_00163367;
    }
    break;
  default:
    if ((local_288.Length == 0x20) &&
       (auVar6[0] = -(((bool *)local_288.Data)[0x10] == (bool)'u'),
       auVar6[1] = -(((bool *)local_288.Data)[0x11] == (bool)'l'),
       auVar6[2] = -(((bool *)local_288.Data)[0x12] == (bool)'e'),
       auVar6[3] = -(((bool *)local_288.Data)[0x13] == (bool)'-'),
       auVar6[4] = -(((bool *)local_288.Data)[0x14] == (bool)'o'),
       auVar6[5] = -(((bool *)local_288.Data)[0x15] == (bool)'p'),
       auVar6[6] = -(((bool *)local_288.Data)[0x16] == (bool)'t'),
       auVar6[7] = -(((bool *)local_288.Data)[0x17] == (bool)'i'),
       auVar6[8] = -(((bool *)local_288.Data)[0x18] == (bool)'m'),
       auVar6[9] = -(((bool *)local_288.Data)[0x19] == (bool)'i'),
       auVar6[10] = -(((bool *)local_288.Data)[0x1a] == (bool)'z'),
       auVar6[0xb] = -(((bool *)local_288.Data)[0x1b] == (bool)'a'),
       auVar6[0xc] = -(((bool *)local_288.Data)[0x1c] == (bool)'t'),
       auVar6[0xd] = -(((bool *)local_288.Data)[0x1d] == (bool)'i'),
       auVar6[0xe] = -(((bool *)local_288.Data)[0x1e] == (bool)'o'),
       auVar6[0xf] = -(((bool *)local_288.Data)[0x1f] == (bool)'n'),
       auVar4[0] = -(*local_288.Data == 'e'),
       auVar4[1] = -(((bool *)local_288.Data)[1] == (bool)'n'),
       auVar4[2] = -(((bool *)local_288.Data)[2] == (bool)'a'),
       auVar4[3] = -(((bool *)local_288.Data)[3] == (bool)'b'),
       auVar4[4] = -(((bool *)local_288.Data)[4] == (bool)'l'),
       auVar4[5] = -(((bool *)local_288.Data)[5] == (bool)'e'),
       auVar4[6] = -(((bool *)local_288.Data)[6] == (bool)'-'),
       auVar4[7] = -(((bool *)local_288.Data)[7] == (bool)'w'),
       auVar4[8] = -(((bool *)local_288.Data)[8] == (bool)'h'),
       auVar4[9] = -(((bool *)local_288.Data)[9] == (bool)'o'),
       auVar4[10] = -(((bool *)local_288.Data)[10] == (bool)'l'),
       auVar4[0xb] = -(((bool *)local_288.Data)[0xb] == (bool)'e'),
       auVar4[0xc] = -(((bool *)local_288.Data)[0xc] == (bool)'-'),
       auVar4[0xd] = -(((bool *)local_288.Data)[0xd] == (bool)'m'),
       auVar4[0xe] = -(((bool *)local_288.Data)[0xe] == (bool)'o'),
       auVar4[0xf] = -(((bool *)local_288.Data)[0xf] == (bool)'d'), auVar4 = auVar4 & auVar6,
       (ushort)((ushort)(SUB161(auVar4 >> 7,0) & 1) | (ushort)(SUB161(auVar4 >> 0xf,0) & 1) << 1 |
                (ushort)(SUB161(auVar4 >> 0x17,0) & 1) << 2 |
                (ushort)(SUB161(auVar4 >> 0x1f,0) & 1) << 3 |
                (ushort)(SUB161(auVar4 >> 0x27,0) & 1) << 4 |
                (ushort)(SUB161(auVar4 >> 0x2f,0) & 1) << 5 |
                (ushort)(SUB161(auVar4 >> 0x37,0) & 1) << 6 |
                (ushort)(SUB161(auVar4 >> 0x3f,0) & 1) << 7 |
                (ushort)(SUB161(auVar4 >> 0x47,0) & 1) << 8 |
                (ushort)(SUB161(auVar4 >> 0x4f,0) & 1) << 9 |
                (ushort)(SUB161(auVar4 >> 0x57,0) & 1) << 10 |
                (ushort)(SUB161(auVar4 >> 0x5f,0) & 1) << 0xb |
                (ushort)(SUB161(auVar4 >> 0x67,0) & 1) << 0xc |
                (ushort)(SUB161(auVar4 >> 0x6f,0) & 1) << 0xd |
                (ushort)(SUB161(auVar4 >> 0x77,0) & 1) << 0xe |
               (ushort)(byte)(auVar4[0xf] >> 7) << 0xf) == 0xffff)) {
      ctx_00 = (ConfigureContext *)&this->enableWholeModuleOptimization;
      pcVar2 = (char *)0x20;
      local_278 = name_00.Length;
      pcStack_270 = pcVar3;
LAB_001632db:
      name_00.Data = pcVar2;
      bVar1 = configureBool((SwiftCompilerShellCommand *)ctx,ctx_00,(bool *)local_288.Data,name_00,
                            value);
      if (bVar1) {
        return true;
      }
      return false;
    }
  }
  bVar1 = llbuild::buildsystem::ExternalCommand::configureAttribute
                    (&this->super_ExternalCommand,ctx,name,value);
  return bVar1;
}

Assistant:

virtual bool configureAttribute(const ConfigureContext& ctx, StringRef name,
                                  StringRef value) override {
    if (name == "executable") {
      executable = value;
    } else if (name == "module-name") {
      moduleName = value;
    } else if (name == "module-output-path") {
      moduleOutputPath = value;
    } else if (name == "sources") {
      SmallVector<StringRef, 32> sources;
      StringRef(value).split(sources, " ", /*MaxSplit=*/-1,
                             /*KeepEmpty=*/false);
      sourcesList = std::vector<std::string>(sources.begin(), sources.end());
    } else if (name == "objects") {
      SmallVector<StringRef, 32> objects;
      StringRef(value).split(objects, " ", /*MaxSplit=*/-1,
                             /*KeepEmpty=*/false);
      objectsList = std::vector<std::string>(objects.begin(), objects.end());
    } else if (name == "import-paths") {
      SmallVector<StringRef, 32> imports;
      StringRef(value).split(imports, " ", /*MaxSplit=*/-1,
                             /*KeepEmpty=*/false);
      importPaths = std::vector<std::string>(imports.begin(), imports.end());
    } else if (name == "temps-path") {
      tempsPath = value;
    } else if (name == "is-library") {
      if (!configureBool(ctx, isLibrary, name, value))
        return false;
    } else if (name == "enable-whole-module-optimization") {
      if (!configureBool(ctx, enableWholeModuleOptimization, name, value))
        return false;
    } else if (name == "num-threads") {
      int numThreadsInt = 0;
      if (value.getAsInteger(10, numThreadsInt)) {
        ctx.error("'" + name + "' should be an int.");
        return false;
      }
      if (numThreadsInt < 0) {
        ctx.error("'" + name + "' should be greater than or equal to zero.");
        return false;
      }
      numThreads = value;
    } else if (name == "other-args") {
      SmallVector<StringRef, 32> args;
      StringRef(value).split(args, " ", /*MaxSplit=*/-1,
                             /*KeepEmpty=*/false);
      otherArgs = std::vector<std::string>(args.begin(), args.end());
    } else {
      return ExternalCommand::configureAttribute(ctx, name, value);
    }

    return true;
  }